

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O0

void __thiscall
Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::
Bitfield_encoding(Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_> *this,
                 vertex_t n,dimension_t k)

{
  int iVar1;
  overflow_error *this_00;
  string local_150;
  string local_130;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined4 local_1c;
  char local_15;
  int available_bits;
  dimension_t k_local;
  Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_> *pBStack_10;
  vertex_t n_local;
  Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_> *this_local;
  
  local_15 = k;
  available_bits = n;
  pBStack_10 = this;
  iVar1 = log2up<int>(n);
  this->bits_per_vertex = iVar1;
  local_1c = 0x80;
  this->extra_bits = 0x80 - this->bits_per_vertex * (int)local_15;
  if (this->extra_bits < 0) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_100,local_15 + -1);
    std::operator+(&local_e0,"cannot encode all simplices of dimension ",&local_100);
    std::operator+(&local_c0,&local_e0," with ");
    std::__cxx11::to_string(&local_130,available_bits);
    std::operator+(&local_a0,&local_c0,&local_130);
    std::operator+(&local_80,&local_a0," vertices using only ");
    std::__cxx11::to_string(&local_150,0x80);
    std::operator+(&local_60,&local_80,&local_150);
    std::operator+(&local_40,&local_60," bits");
    std::overflow_error::overflow_error(this_00,(string *)&local_40);
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  return;
}

Assistant:

Bitfield_encoding(vertex_t n, dimension_t k) : bits_per_vertex(log2up(n)) {
      static_assert(std::numeric_limits<simplex_t>::radix == 2);
      const int available_bits = std::numeric_limits<simplex_t>::digits;
      extra_bits = available_bits - bits_per_vertex * k;
      if (extra_bits < 0)
        throw std::overflow_error("cannot encode all simplices of dimension " + std::to_string(k - 1) + " with " + std::to_string(n) + " vertices using only " + std::to_string(available_bits) + " bits");
      // The message is a bit misleading, it is tuples that we cannot encode, and just with this representation.
    }